

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O0

int __thiscall
cmCTestScriptHandler::ExecuteScript(cmCTestScriptHandler *this,string *total_script_arg)

{
  cmCTest *pcVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  string *psVar6;
  char *pcVar7;
  size_type sVar8;
  cmsysProcess *cp_00;
  char **command;
  void *this_00;
  reference ppcVar9;
  reference ppcVar10;
  string local_f90 [32];
  string local_f70 [32];
  undefined1 local_f50 [8];
  ostringstream cmCTestLog_msg_7;
  char *arg;
  iterator __end2;
  iterator __begin2;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range2;
  ostringstream message;
  string local_c40 [32];
  undefined1 local_c20 [8];
  ostringstream cmCTestLog_msg_6;
  string local_aa8 [32];
  undefined1 local_a88 [8];
  ostringstream cmCTestLog_msg_5;
  string local_910 [32];
  undefined1 local_8f0 [8];
  ostringstream cmCTestLog_msg_4;
  int local_774;
  bool failed;
  int retVal;
  int result;
  cmDuration local_760;
  string local_758 [32];
  undefined1 local_738 [8];
  ostringstream cmCTestLog_msg_3;
  string local_5c0 [32];
  undefined1 local_5a0 [8];
  ostringstream cmCTestLog_msg_2;
  string local_428 [32];
  undefined1 local_408 [8];
  ostringstream cmCTestLog_msg_1;
  int local_28c;
  duration<long,_std::ratio<1L,_1L>_> local_288;
  cmDuration local_280;
  int local_274;
  undefined1 local_270 [4];
  int pipe;
  string line;
  vector<char,_std::allocator<char>_> err;
  vector<char,_std::allocator<char>_> out;
  cmsysProcess *cp;
  value_type local_210;
  ulong local_208;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *initArgs;
  undefined1 local_1d8 [8];
  ostringstream cmCTestLog_msg;
  value_type local_60;
  char *local_58 [3];
  value_type local_40;
  undefined1 local_38 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  string *total_script_arg_local;
  cmCTestScriptHandler *this_local;
  
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)total_script_arg;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38);
  cmSystemTools::GetCTestCommand_abi_cxx11_();
  local_40 = (value_type)std::__cxx11::string::c_str();
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38,&local_40);
  local_58[0] = "-SR";
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38,local_58);
  local_60 = (value_type)std::__cxx11::string::c_str();
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38,&local_60);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
  poVar5 = std::operator<<((ostream *)local_1d8,"Executable for CTest is: ");
  psVar6 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  poVar5 = std::operator<<(poVar5,(string *)psVar6);
  std::operator<<(poVar5,"\n");
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  pcVar7 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
               ,0x91,pcVar7,false);
  std::__cxx11::string::~string((string *)&initArgs);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
  i = (size_t)cmCTest::GetInitialCommandLineArguments_abi_cxx11_
                        ((this->super_cmCTestGenericHandler).CTest);
  for (local_208 = 1; uVar2 = local_208,
      sVar8 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)i), uVar2 < sVar8; local_208 = local_208 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)i,local_208);
    local_210 = (value_type)std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38,&local_210);
  }
  cp = (cmsysProcess *)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38,(value_type *)&cp);
  cp_00 = cmsysProcess_New();
  command = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38);
  cmsysProcess_SetCommand(cp_00,command);
  cmsysProcess_SetOption(cp_00,0,1);
  cmsysProcess_Execute(cp_00);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)
             &err.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)((long)&line.field_2 + 8));
  std::__cxx11::string::string((string *)local_270);
  local_28c = 100;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_288,&local_28c);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1l>,void>
            ((duration<double,std::ratio<1l,1l>> *)&local_280,&local_288);
  local_274 = cmSystemTools::WaitForLine
                        (cp_00,(string *)local_270,local_280,
                         (vector<char,_std::allocator<char>_> *)
                         &err.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                         (vector<char,_std::allocator<char>_> *)((long)&line.field_2 + 8));
  while (local_274 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_408);
    poVar5 = std::operator<<((ostream *)local_408,"Output: ");
    poVar5 = std::operator<<(poVar5,(string *)local_270);
    std::operator<<(poVar5,"\n");
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                 ,0xab,pcVar7,false);
    std::__cxx11::string::~string(local_428);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_408);
    if (local_274 == 3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a0);
      poVar5 = std::operator<<((ostream *)local_5a0,(string *)local_270);
      std::operator<<(poVar5,"\n");
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                   ,0xad,pcVar7,false);
      std::__cxx11::string::~string(local_5c0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5a0);
    }
    else if (local_274 == 2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_738);
      poVar5 = std::operator<<((ostream *)local_738,(string *)local_270);
      std::operator<<(poVar5,"\n");
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                   ,0xaf,pcVar7,false);
      std::__cxx11::string::~string(local_758);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_738);
    }
    retVal = 100;
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&result,&retVal);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_760,
               (duration<long,_std::ratio<1L,_1L>_> *)&result);
    local_274 = cmSystemTools::WaitForLine
                          (cp_00,(string *)local_270,local_760,
                           (vector<char,_std::allocator<char>_> *)
                           &err.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                           (vector<char,_std::allocator<char>_> *)((long)&line.field_2 + 8));
  }
  cmsysProcess_WaitForExit(cp_00,(double *)0x0);
  iVar4 = cmsysProcess_GetState(cp_00);
  local_774 = 0;
  bVar3 = false;
  if (iVar4 == 4) {
    local_774 = cmsysProcess_GetExitValue(cp_00);
  }
  else if (iVar4 == 2) {
    local_774 = cmsysProcess_GetExitException(cp_00);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8f0);
    poVar5 = std::operator<<((ostream *)local_8f0,"\tThere was an exception: ");
    pcVar7 = cmsysProcess_GetExceptionString(cp_00);
    poVar5 = std::operator<<(poVar5,pcVar7);
    poVar5 = std::operator<<(poVar5," ");
    this_00 = (void *)std::ostream::operator<<(poVar5,local_774);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                 ,0xc1,pcVar7,false);
    std::__cxx11::string::~string(local_910);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8f0);
    bVar3 = true;
  }
  else if (iVar4 == 5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a88);
    poVar5 = std::operator<<((ostream *)local_a88,"\tThere was a timeout");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                 ,0xc5,pcVar7,false);
    std::__cxx11::string::~string(local_aa8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a88);
    bVar3 = true;
  }
  else {
    bVar3 = iVar4 == 1;
    if (bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c20);
      poVar5 = std::operator<<((ostream *)local_c20,"\tError executing ctest: ");
      pcVar7 = cmsysProcess_GetErrorString(cp_00);
      poVar5 = std::operator<<(poVar5,pcVar7);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                   ,0xca,pcVar7,false);
      std::__cxx11::string::~string(local_c40);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c20);
    }
  }
  cmsysProcess_Delete(cp_00);
  if (bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range2);
    std::operator<<((ostream *)&__range2,"Error running command: [");
    poVar5 = (ostream *)std::ostream::operator<<(&__range2,iVar4);
    std::operator<<(poVar5,"] ");
    __end2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                       ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38);
    arg = (char *)std::vector<const_char_*,_std::allocator<const_char_*>_>::end
                            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                       *)&arg), bVar3) {
      ppcVar9 = __gnu_cxx::
                __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                ::operator*(&__end2);
      if (*ppcVar9 != (char *)0x0) {
        poVar5 = std::operator<<((ostream *)&__range2,*ppcVar9);
        std::operator<<(poVar5," ");
      }
      __gnu_cxx::
      __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
      operator++(&__end2);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f50);
    std::__cxx11::ostringstream::str();
    poVar5 = std::operator<<((ostream *)local_f50,local_f70);
    ppcVar10 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                         ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38,0);
    poVar5 = std::operator<<(poVar5,*ppcVar10);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_f70);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                 ,0xd8,pcVar7,false);
    std::__cxx11::string::~string(local_f90);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f50);
    this_local._4_4_ = -1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range2);
  }
  else {
    this_local._4_4_ = local_774;
  }
  std::__cxx11::string::~string((string *)local_270);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)((long)&line.field_2 + 8));
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)
             &err.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38);
  return this_local._4_4_;
}

Assistant:

int cmCTestScriptHandler::ExecuteScript(const std::string& total_script_arg)
{
  // execute the script passing in the arguments to the script as well as the
  // arguments from this invocation of cmake
  std::vector<const char*> argv;
  argv.push_back(cmSystemTools::GetCTestCommand().c_str());
  argv.push_back("-SR");
  argv.push_back(total_script_arg.c_str());

  cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
             "Executable for CTest is: " << cmSystemTools::GetCTestCommand()
                                         << "\n");

  // now pass through all the other arguments
  std::vector<std::string>& initArgs =
    this->CTest->GetInitialCommandLineArguments();
  //*** need to make sure this does not have the current script ***
  for (size_t i = 1; i < initArgs.size(); ++i) {
    argv.push_back(initArgs[i].c_str());
  }
  argv.push_back(nullptr);

  // Now create process object
  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, argv.data());
  // cmsysProcess_SetWorkingDirectory(cp, dir);
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  // cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  std::vector<char> out;
  std::vector<char> err;
  std::string line;
  int pipe =
    cmSystemTools::WaitForLine(cp, line, std::chrono::seconds(100), out, err);
  while (pipe != cmsysProcess_Pipe_None) {
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               "Output: " << line << "\n");
    if (pipe == cmsysProcess_Pipe_STDERR) {
      cmCTestLog(this->CTest, ERROR_MESSAGE, line << "\n");
    } else if (pipe == cmsysProcess_Pipe_STDOUT) {
      cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT, line << "\n");
    }
    pipe = cmSystemTools::WaitForLine(cp, line, std::chrono::seconds(100), out,
                                      err);
  }

  // Properly handle output of the build command
  cmsysProcess_WaitForExit(cp, nullptr);
  int result = cmsysProcess_GetState(cp);
  int retVal = 0;
  bool failed = false;
  if (result == cmsysProcess_State_Exited) {
    retVal = cmsysProcess_GetExitValue(cp);
  } else if (result == cmsysProcess_State_Exception) {
    retVal = cmsysProcess_GetExitException(cp);
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "\tThere was an exception: "
                 << cmsysProcess_GetExceptionString(cp) << " " << retVal
                 << std::endl);
    failed = true;
  } else if (result == cmsysProcess_State_Expired) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "\tThere was a timeout" << std::endl);
    failed = true;
  } else if (result == cmsysProcess_State_Error) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "\tError executing ctest: " << cmsysProcess_GetErrorString(cp)
                                           << std::endl);
    failed = true;
  }
  cmsysProcess_Delete(cp);
  if (failed) {
    std::ostringstream message;
    message << "Error running command: [";
    message << result << "] ";
    for (const char* arg : argv) {
      if (arg) {
        message << arg << " ";
      }
    }
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               message.str() << argv[0] << std::endl);
    return -1;
  }
  return retVal;
}